

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit1304.c
# Opt level: O3

int test(char *arg)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  pcVar2 = strdup("");
  password = pcVar2;
  pcVar3 = strdup("");
  login = pcVar3;
  if (pcVar2 == (char *)0x0 || pcVar3 == (char *)0x0) {
    free(pcVar2);
    password = (char *)0x0;
    free(pcVar3);
    login = (char *)0x0;
    curl_mfprintf(_stderr,"%s:%d test failed: \'%s\'\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                  ,0x30,"unit_setup() failure");
    unitfail = unitfail + 1;
    return unitfail;
  }
  builtin_strncpy(filename + 8,"c1304",5);
  builtin_strncpy(filename,"log/netr",8);
  iVar1 = Curl_parsenetrc("test.example.com",&login,&password,filename);
  if (iVar1 != 1) {
    curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                  ,0x3a,"result == 1","Host not found should return 1");
    unitfail = unitfail + 1;
  }
  if (password == (char *)0x0) {
    pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
    pcVar3 = "password != NULL";
    pcVar5 = "returned NULL!";
    uVar4 = 0x3b;
  }
  else {
    if (*password != '\0') {
      curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                    ,0x3c,"password[0] == 0","password should not have been changed");
      unitfail = unitfail + 1;
    }
    if (login == (char *)0x0) {
      pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
      pcVar3 = "login != NULL";
      pcVar5 = "returned NULL!";
      uVar4 = 0x3d;
    }
    else {
      if (*login != '\0') {
        curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                      ,0x3e,"login[0] == 0","login should not have been changed");
        unitfail = unitfail + 1;
      }
      free(login);
      login = strdup("me");
      if (login == (char *)0x0) {
        pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
        pcVar3 = "login != NULL";
        pcVar5 = "returned NULL!";
        uVar4 = 0x45;
      }
      else {
        iVar1 = Curl_parsenetrc("example.com",&login,&password,filename);
        if (iVar1 != 0) {
          curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                        ,0x47,"result == 0","Host should be found");
          unitfail = unitfail + 1;
        }
        if (password == (char *)0x0) {
          pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
          pcVar3 = "password != NULL";
          pcVar5 = "returned NULL!";
          uVar4 = 0x48;
        }
        else {
          if (*password != '\0') {
            curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                          ,0x49,"password[0] == 0","password should not have been changed");
            unitfail = unitfail + 1;
          }
          if (login == (char *)0x0) {
            pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
            pcVar3 = "login != NULL";
            pcVar5 = "returned NULL!";
            uVar4 = 0x4a;
          }
          else {
            if ((*login != 'm') || (login[1] != 'e')) {
              curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                            ,0x4c,"strncmp(login, \"me\", 2) == 0",
                            "login should not have been changed");
              unitfail = unitfail + 1;
            }
            free(login);
            login = strdup("me");
            if (login == (char *)0x0) {
              pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
              pcVar3 = "login != NULL";
              pcVar5 = "returned NULL!";
              uVar4 = 0x53;
            }
            else {
              iVar1 = Curl_parsenetrc("test.example.com",&login,&password,filename);
              if (iVar1 != 1) {
                curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                              ,0x55,"result == 1","Host should be found");
                unitfail = unitfail + 1;
              }
              if (password == (char *)0x0) {
                pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                pcVar3 = "password != NULL";
                pcVar5 = "returned NULL!";
                uVar4 = 0x56;
              }
              else {
                if (*password != '\0') {
                  curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                ,0x57,"password[0] == 0","password should not have been changed");
                  unitfail = unitfail + 1;
                }
                if (login == (char *)0x0) {
                  pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                  pcVar3 = "login != NULL";
                  pcVar5 = "returned NULL!";
                  uVar4 = 0x58;
                }
                else {
                  if ((*login != 'm') || (login[1] != 'e')) {
                    curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                  ,0x5a,"strncmp(login, \"me\", 2) == 0",
                                  "login should not have been changed");
                    unitfail = unitfail + 1;
                  }
                  free(login);
                  login = strdup("admi");
                  if (login == (char *)0x0) {
                    pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                    pcVar3 = "login != NULL";
                    pcVar5 = "returned NULL!";
                    uVar4 = 0x62;
                  }
                  else {
                    iVar1 = Curl_parsenetrc("example.com",&login,&password,filename);
                    if (iVar1 != 0) {
                      curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                    ,100,"result == 0","Host should be found");
                      unitfail = unitfail + 1;
                    }
                    if (password == (char *)0x0) {
                      pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                      pcVar3 = "password != NULL";
                      pcVar5 = "returned NULL!";
                      uVar4 = 0x65;
                    }
                    else {
                      if (*password != '\0') {
                        curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                      ,0x66,"password[0] == 0",
                                      "password should not have been changed");
                        unitfail = unitfail + 1;
                      }
                      pcVar2 = login;
                      if (login == (char *)0x0) {
                        pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                        pcVar3 = "login != NULL";
                        pcVar5 = "returned NULL!";
                        uVar4 = 0x67;
                      }
                      else {
                        iVar1 = strncmp(login,"admi",4);
                        if (iVar1 != 0) {
                          curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                        ,0x69,"strncmp(login, \"admi\", 4) == 0",
                                        "login should not have been changed");
                          unitfail = unitfail + 1;
                          pcVar2 = login;
                        }
                        free(pcVar2);
                        login = strdup("adminn");
                        if (login == (char *)0x0) {
                          pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                          pcVar3 = "login != NULL";
                          pcVar5 = "returned NULL!";
                          uVar4 = 0x71;
                        }
                        else {
                          iVar1 = Curl_parsenetrc("example.com",&login,&password,filename);
                          if (iVar1 != 0) {
                            curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                          ,0x73,"result == 0","Host should be found");
                            unitfail = unitfail + 1;
                          }
                          if (password == (char *)0x0) {
                            pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                            pcVar3 = "password != NULL";
                            pcVar5 = "returned NULL!";
                            uVar4 = 0x74;
                          }
                          else {
                            if (*password != '\0') {
                              curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                            ,0x75,"password[0] == 0",
                                            "password should not have been changed");
                              unitfail = unitfail + 1;
                            }
                            pcVar2 = login;
                            if (login == (char *)0x0) {
                              pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                              pcVar3 = "login != NULL";
                              pcVar5 = "returned NULL!";
                              uVar4 = 0x76;
                            }
                            else {
                              iVar1 = strncmp(login,"adminn",6);
                              if (iVar1 != 0) {
                                curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                              ,0x78,"strncmp(login, \"adminn\", 6) == 0",
                                              "login should not have been changed");
                                unitfail = unitfail + 1;
                                pcVar2 = login;
                              }
                              free(pcVar2);
                              login = strdup("");
                              if (login == (char *)0x0) {
                                pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                pcVar3 = "login != NULL";
                                pcVar5 = "returned NULL!";
                                uVar4 = 0x80;
                              }
                              else {
                                iVar1 = Curl_parsenetrc("example.com",&login,&password,filename);
                                if (iVar1 != 0) {
                                  curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                ,0x82,"result == 0","Host should have been found");
                                  unitfail = unitfail + 1;
                                }
                                if (password == (char *)0x0) {
                                  pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                  pcVar3 = "password != NULL";
                                  pcVar5 = "returned NULL!";
                                  uVar4 = 0x83;
                                }
                                else {
                                  iVar1 = strncmp(password,"passwd",6);
                                  if (iVar1 != 0) {
                                    curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0x85,"strncmp(password, \"passwd\", 6) == 0",
                                                  "password should be \'passwd\'");
                                    unitfail = unitfail + 1;
                                  }
                                  if (login == (char *)0x0) {
                                    pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                    pcVar3 = "login != NULL";
                                    pcVar5 = "returned NULL!";
                                    uVar4 = 0x86;
                                  }
                                  else {
                                    iVar1 = strncmp(login,"admin",5);
                                    if (iVar1 != 0) {
                                      curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0x87,"strncmp(login, \"admin\", 5) == 0",
                                                  "login should be \'admin\'");
                                      unitfail = unitfail + 1;
                                    }
                                    free(password);
                                    password = strdup("");
                                    if (password == (char *)0x0) {
                                      pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                      pcVar3 = "password != NULL";
                                      pcVar5 = "returned NULL!";
                                      uVar4 = 0x8f;
                                    }
                                    else {
                                      iVar1 = Curl_parsenetrc("example.com",&login,&password,
                                                              filename);
                                      if (iVar1 != 0) {
                                        curl_mfprintf(_stderr,"%s:%d Assertion \'%s\' failed: %s\n",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0x91,"result == 0","Host should have been found")
                                        ;
                                        unitfail = unitfail + 1;
                                      }
                                      if (password == (char *)0x0) {
                                        pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                        pcVar3 = "password != NULL";
                                        pcVar5 = "returned NULL!";
                                        uVar4 = 0x92;
                                      }
                                      else {
                                        iVar1 = strncmp(password,"passwd",6);
                                        if (iVar1 != 0) {
                                          curl_mfprintf(_stderr,
                                                  "%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0x94,"strncmp(password, \"passwd\", 6) == 0",
                                                  "password should be \'passwd\'");
                                          unitfail = unitfail + 1;
                                        }
                                        if (login == (char *)0x0) {
                                          pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                          pcVar3 = "login != NULL";
                                          pcVar5 = "returned NULL!";
                                          uVar4 = 0x95;
                                        }
                                        else {
                                          iVar1 = strncmp(login,"admin",5);
                                          if (iVar1 != 0) {
                                            curl_mfprintf(_stderr,
                                                  "%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0x96,"strncmp(login, \"admin\", 5) == 0",
                                                  "login should be \'admin\'");
                                            unitfail = unitfail + 1;
                                          }
                                          free(password);
                                          password = strdup("");
                                          if (password == (char *)0x0) {
                                            pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                            pcVar3 = "password != NULL";
                                            pcVar5 = "returned NULL!";
                                            uVar4 = 0x9e;
                                          }
                                          else {
                                            free(login);
                                            login = strdup("");
                                            if (login == (char *)0x0) {
                                              pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n";
                                              pcVar3 = "login != NULL";
                                              pcVar5 = "returned NULL!";
                                              uVar4 = 0xa1;
                                            }
                                            else {
                                              iVar1 = Curl_parsenetrc("curl.example.com",&login,
                                                                      &password,filename);
                                              if (iVar1 != 0) {
                                                curl_mfprintf(_stderr,
                                                  "%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0xa3,"result == 0","Host should have been found")
                                                ;
                                                unitfail = unitfail + 1;
                                              }
                                              if (password == (char *)0x0) {
                                                pcVar2 = "%s:%d Abort assertion \'%s\' failed: %s\n"
                                                ;
                                                pcVar3 = "password != NULL";
                                                pcVar5 = "returned NULL!";
                                                uVar4 = 0xa4;
                                              }
                                              else {
                                                iVar1 = strncmp(password,"none",4);
                                                if (iVar1 != 0) {
                                                  curl_mfprintf(_stderr,
                                                  "%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0xa6,"strncmp(password, \"none\", 4) == 0",
                                                  "password should be \'none\'");
                                                  unitfail = unitfail + 1;
                                                }
                                                if (login == (char *)0x0) {
                                                  pcVar2 = 
                                                  "%s:%d Abort assertion \'%s\' failed: %s\n";
                                                  pcVar3 = "login != NULL";
                                                  pcVar5 = "returned NULL!";
                                                  uVar4 = 0xa7;
                                                }
                                                else {
                                                  iVar1 = strncmp(login,"none",4);
                                                  if (iVar1 != 0) {
                                                    curl_mfprintf(_stderr,
                                                  "%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0xa8,"strncmp(login, \"none\", 4) == 0",
                                                  "login should be \'none\'");
                                                  unitfail = unitfail + 1;
                                                  }
                                                  free(password);
                                                  password = strdup("");
                                                  if (password == (char *)0x0) {
                                                    pcVar2 = 
                                                  "%s:%d Abort assertion \'%s\' failed: %s\n";
                                                  pcVar3 = "password != NULL";
                                                  pcVar5 = "returned NULL!";
                                                  uVar4 = 0xb0;
                                                  }
                                                  else {
                                                    iVar1 = Curl_parsenetrc("curl.example.com",
                                                                            &login,&password,
                                                                            filename);
                                                    if (iVar1 != 0) {
                                                      curl_mfprintf(_stderr,
                                                  "%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0xb2,"result == 0","Host should have been found")
                                                  ;
                                                  unitfail = unitfail + 1;
                                                  }
                                                  if (password == (char *)0x0) {
                                                    pcVar2 = 
                                                  "%s:%d Abort assertion \'%s\' failed: %s\n";
                                                  pcVar3 = "password != NULL";
                                                  pcVar5 = "returned NULL!";
                                                  uVar4 = 0xb3;
                                                  }
                                                  else {
                                                    iVar1 = strncmp(password,"none",4);
                                                    if (iVar1 != 0) {
                                                      curl_mfprintf(_stderr,
                                                  "%s:%d Assertion \'%s\' failed: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                                                  ,0xb5,"strncmp(password, \"none\", 4) == 0",
                                                  "password should be \'none\'");
                                                  unitfail = unitfail + 1;
                                                  }
                                                  if (login == (char *)0x0) {
                                                    pcVar2 = 
                                                  "%s:%d Abort assertion \'%s\' failed: %s\n";
                                                  pcVar3 = "login != NULL";
                                                  pcVar5 = "returned NULL!";
                                                  uVar4 = 0xb6;
                                                  }
                                                  else {
                                                    iVar1 = strncmp(login,"none",4);
                                                    if (iVar1 == 0) goto LAB_001022af;
                                                    pcVar2 = "%s:%d Assertion \'%s\' failed: %s\n";
                                                    pcVar3 = "strncmp(login, \"none\", 4) == 0";
                                                    pcVar5 = "login should be \'none\'";
                                                    uVar4 = 0xb7;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  curl_mfprintf(_stderr,pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/unit/unit1304.c"
                ,uVar4,pcVar3,pcVar5);
  unitfail = unitfail + 1;
LAB_001022af:
  free(password);
  password = (char *)0x0;
  free(login);
  login = (char *)0x0;
  return unitfail;
}

Assistant:

static CURLcode unit_setup(void)
{
  password = strdup("");
  login = strdup("");
  if(!password || !login) {
    Curl_safefree(password);
    Curl_safefree(login);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}